

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult __thiscall
VmaBlockVector::AllocateFromBlock
          (VmaBlockVector *this,VmaDeviceMemoryBlock *pBlock,VkDeviceSize size,
          VkDeviceSize alignment,VmaAllocationCreateFlags allocFlags,void *pUserData,
          VmaSuballocationType suballocType,uint32_t strategy,VmaAllocation *pAllocation)

{
  int iVar1;
  VkResult VVar2;
  VmaAllocationRequest local_68;
  
  local_68.customData = (void *)0x0;
  local_68.algorithmData = 0;
  local_68.item.m_pList = (VmaRawList<VmaSuballocation> *)0x0;
  local_68.item.m_pItem = (VmaListItem<VmaSuballocation> *)0x0;
  local_68.allocHandle = (VmaAllocHandle)0x0;
  local_68.size = 0;
  local_68.type = Normal;
  iVar1 = (*pBlock->m_pMetadata->_vptr_VmaBlockMetadata[0x11])
                    (pBlock->m_pMetadata,size,alignment,(ulong)((allocFlags & 0x40) >> 6),
                     (ulong)suballocType,(ulong)strategy,&local_68);
  VVar2 = VK_ERROR_OUT_OF_DEVICE_MEMORY;
  if ((char)iVar1 != '\0') {
    VVar2 = CommitAllocationRequest
                      (this,&local_68,pBlock,alignment,allocFlags,pUserData,suballocType,pAllocation
                      );
  }
  return VVar2;
}

Assistant:

VkResult VmaBlockVector::AllocateFromBlock(
    VmaDeviceMemoryBlock* pBlock,
    VkDeviceSize size,
    VkDeviceSize alignment,
    VmaAllocationCreateFlags allocFlags,
    void* pUserData,
    VmaSuballocationType suballocType,
    uint32_t strategy,
    VmaAllocation* pAllocation)
{
    const bool isUpperAddress = (allocFlags & VMA_ALLOCATION_CREATE_UPPER_ADDRESS_BIT) != 0;

    VmaAllocationRequest currRequest = {};
    if (pBlock->m_pMetadata->CreateAllocationRequest(
        size,
        alignment,
        isUpperAddress,
        suballocType,
        strategy,
        &currRequest))
    {
        return CommitAllocationRequest(currRequest, pBlock, alignment, allocFlags, pUserData, suballocType, pAllocation);
    }
    return VK_ERROR_OUT_OF_DEVICE_MEMORY;
}